

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O3

REF_STATUS ref_adj_remove(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  REF_ADJ_ITEM pRVar1;
  REF_STATUS RVar2;
  int iVar3;
  long lVar4;
  
  RVar2 = 3;
  if ((-1 < node) && (node < ref_adj->nnode)) {
    lVar4 = (long)ref_adj->first[(uint)node];
    if (lVar4 != -1) {
      pRVar1 = ref_adj->item;
      if (pRVar1[lVar4].ref == reference) {
        ref_adj->first[(uint)node] = pRVar1[lVar4].next;
      }
      else {
        do {
          iVar3 = (int)lVar4;
          lVar4 = (long)pRVar1[iVar3].next;
          if (lVar4 == -1) {
            return 3;
          }
        } while (pRVar1[lVar4].ref != reference);
        pRVar1[iVar3].next = pRVar1[lVar4].next;
      }
      pRVar1[lVar4].next = ref_adj->blank;
      ref_adj->blank = (REF_INT)lVar4;
      pRVar1[lVar4].ref = -1;
      RVar2 = 0;
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_remove(REF_ADJ ref_adj, REF_INT node,
                                  REF_INT reference) {
  REF_INT item, ref;
  REF_INT target, parent;

  item = ref_adj_first(ref_adj, node);

  if (!ref_adj_valid(item)) return REF_INVALID;

  if (reference == ref_adj_item_ref(ref_adj, item)) {
    ref_adj->first[node] = ref_adj_item_next(ref_adj, item);
    ref_adj_item_next(ref_adj, item) = ref_adj_blank(ref_adj);
    ref_adj_blank(ref_adj) = item;
    ref_adj_item_ref(ref_adj, item) = REF_EMPTY;
    return REF_SUCCESS;
  }

  target = REF_EMPTY;
  parent = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    if (ref == reference) {
      target = item;
      break;
    } else {
      parent = item;
    }
  }

  if (REF_EMPTY == target) return REF_INVALID;

  if (REF_EMPTY == parent) RSS(REF_FAILURE, "parent empty");

  ref_adj_item_next(ref_adj, parent) = ref_adj_item_next(ref_adj, item);
  ref_adj_item_next(ref_adj, item) = ref_adj_blank(ref_adj);
  ref_adj_blank(ref_adj) = item;
  ref_adj_item_ref(ref_adj, item) = REF_EMPTY;

  return REF_SUCCESS;
}